

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

bool __thiscall cfd::core::DescriptorScriptReference::HasAddress(DescriptorScriptReference *this)

{
  bool bVar1;
  DescriptorScriptReference *this_local;
  
  if ((((this->script_type_ == kDescriptorScriptRaw) &&
       (bVar1 = Script::IsP2wpkhScript(&this->locking_script_), !bVar1)) &&
      (bVar1 = Script::IsP2wshScript(&this->locking_script_), !bVar1)) &&
     (((bVar1 = Script::IsTaprootScript(&this->locking_script_), !bVar1 &&
       (bVar1 = Script::IsP2shScript(&this->locking_script_), !bVar1)) &&
      (bVar1 = Script::IsP2pkhScript(&this->locking_script_), !bVar1)))) {
    return false;
  }
  return true;
}

Assistant:

bool DescriptorScriptReference::HasAddress() const {
  if (script_type_ == DescriptorScriptType::kDescriptorScriptRaw) {
    if (locking_script_.IsP2wpkhScript() || locking_script_.IsP2wshScript() ||
        locking_script_.IsTaprootScript() || locking_script_.IsP2shScript() ||
        locking_script_.IsP2pkhScript()) {
      return true;
    }
    return false;
  }
  return true;
}